

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

bool CompressedXipReader::isCompressedXip(ReadWriter_ptr *rd,uint64_t ofs)

{
  uint32_t uVar1;
  uint32_t uVar2;
  element_type *peVar3;
  uint32_t magic;
  uint32_t fullblocksize;
  uint32_t nblocks;
  uint32_t dataofs;
  uint64_t ofs_local;
  ReadWriter_ptr *rd_local;
  
  peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      rd);
  (*peVar3->_vptr_ReadWriter[4])(peVar3,ofs + 0x34);
  peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      rd);
  uVar1 = ReadWriter::read32le(peVar3);
  peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      rd);
  uVar2 = ReadWriter::read32le(peVar3);
  if (uVar1 < uVar2 * 2 + 0x44) {
    if (1 < g_verbose) {
      printf("not cxip: nb(=0x%x)*x+0x44 > do(0x%x)\n",(ulong)uVar2,(ulong)uVar1);
    }
    rd_local._7_1_ = false;
  }
  else {
    peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )rd);
    uVar1 = ReadWriter::read32le(peVar3);
    if ((uVar1 & uVar1 - 1) == 0) {
      if ((ulong)uVar1 * (ulong)uVar2 < 0x40000001) {
        peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)rd);
        uVar1 = ReadWriter::read32le(peVar3);
        if (uVar1 == 0x58505253) {
          rd_local._7_1_ = true;
        }
        else {
          if (1 < g_verbose) {
            printf("not cxip: mg(0x%x)\n",(ulong)uVar1);
          }
          rd_local._7_1_ = false;
        }
      }
      else {
        if (1 < g_verbose) {
          printf("not cxip: fb(0x%x)*nb(0x%x) > 0x40000000\n",(ulong)uVar1,(ulong)uVar2);
        }
        rd_local._7_1_ = false;
      }
    }
    else {
      if (1 < g_verbose) {
        printf("not cxip: fb(0x%x)\n",(ulong)uVar1);
      }
      rd_local._7_1_ = false;
    }
  }
  return rd_local._7_1_;
}

Assistant:

static bool isCompressedXip(ReadWriter_ptr rd, uint64_t ofs)
    {
        rd->setpos(ofs+0x34);
        uint32_t dataofs= rd->read32le();
        uint32_t nblocks= rd->read32le();
        //printf("d=%08x, n=%08x\n", dataofs, nblocks);
        if (nblocks*2+0x44>dataofs) {
            if (g_verbose > 1)
                printf("not cxip: nb(=0x%x)*x+0x44 > do(0x%x)\n", nblocks, dataofs);
            return false;
        }
        uint32_t fullblocksize= rd->read32le();
        //printf("bs=%08x\n", fullblocksize);
        if (fullblocksize & (fullblocksize-1)) {
            if (g_verbose > 1)
                printf("not cxip: fb(0x%x)\n", fullblocksize);
            return false;
        }
        if (uint64_t(fullblocksize)*nblocks > 0x40000000) {
            if (g_verbose > 1)
                printf("not cxip: fb(0x%x)*nb(0x%x) > 0x40000000\n", fullblocksize, nblocks );
            return false;
        }
        uint32_t magic= rd->read32le();
        //printf("mg=%08x\n", magic);
        if (magic!=0x58505253)  {
            if (g_verbose > 1)
                printf("not cxip: mg(0x%x)\n", magic);
            return false;
        }

        return true;
    }